

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O2

optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
* getObject(optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
            *__return_storage_ptr__,Document *value,string *key)

{
  uint16_t uVar1;
  Number NVar2;
  I *pIVar3;
  MemberIterator itr;
  undefined1 local_38 [16];
  Ch *local_28;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)(local_38 + 0x10),(Ch *)value);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(local_38 + 8));
  if ((local_28 == (Ch *)local_38._8_8_) || (*(short *)(local_28 + 0x1e) == 0)) {
    (__return_storage_ptr__->value).data_.n = (Number)0x0;
    (__return_storage_ptr__->value).data_.s.str = (Ch *)0x0;
    __return_storage_ptr__->is_some = false;
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38);
    NVar2.i = *(I *)local_38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).data_ + 6) =
         *(undefined8 *)(local_38._0_8_ + 6);
    (__return_storage_ptr__->value).data_.n = NVar2;
    uVar1 = *(uint16_t *)(local_38._0_8_ + 0xe);
    *(I *)local_38._0_8_ = (I)0x0;
    pIVar3 = (I *)(local_38._0_8_ + 8);
    pIVar3->i = 0;
    pIVar3->padding[0] = '\0';
    pIVar3->padding[1] = '\0';
    pIVar3->padding[2] = '\0';
    pIVar3->padding[3] = '\0';
    ((char *)(local_38._0_8_ + 0xe))[0] = '\x03';
    ((char *)(local_38._0_8_ + 0xe))[1] = '\0';
    (__return_storage_ptr__->value).data_.f.flags = uVar1;
    __return_storage_ptr__->is_some = true;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Value> getObject (Document &value, const string &key) {
    auto itr = value.FindMember(key.c_str());
    if (itr == value.MemberEnd() || itr->value.IsNull()) {
        return {};
    }
    return { itr->value.GetObject() };
}